

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

void set_insert_node(lyxp_set *set,lyd_node *node,uint32_t pos,lyxp_node_type node_type,uint32_t idx
                    )

{
  lyxp_set_node *plVar1;
  uint32_t local_24;
  uint32_t idx_local;
  lyxp_node_type node_type_local;
  uint32_t pos_local;
  lyd_node *node_local;
  lyxp_set *set_local;
  
  if ((set == (lyxp_set *)0x0) ||
     ((set->type != LYXP_SET_NODE_SET && (set->type != LYXP_SET_EMPTY)))) {
    __assert_fail("set && ((set->type == LYXP_SET_NODE_SET) || (set->type == LYXP_SET_EMPTY))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
                  ,0x41a,
                  "void set_insert_node(struct lyxp_set *, const struct lyd_node *, uint32_t, enum lyxp_node_type, uint32_t)"
                 );
  }
  local_24 = idx;
  if (set->type == LYXP_SET_EMPTY) {
    if (idx != 0) {
      ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
             "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
             ,0x420);
      local_24 = 0;
    }
    plVar1 = (lyxp_set_node *)malloc(0x20);
    (set->val).nodes = plVar1;
    if ((set->val).nodes == (lyxp_set_node *)0x0) {
      ly_log((ly_ctx *)0x0,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","set_insert_node");
      return;
    }
    set->type = LYXP_SET_NODE_SET;
    set->used = 0;
    set->size = 2;
    set->ctx_pos = 1;
    set->ctx_size = 1;
    set->ht = (hash_table *)0x0;
  }
  else {
    if (set->used == set->size) {
      plVar1 = (lyxp_set_node *)ly_realloc((set->val).nodes,(ulong)(set->size + 2) << 4);
      (set->val).nodes = plVar1;
      if ((set->val).nodes == (lyxp_set_node *)0x0) {
        ly_log((ly_ctx *)0x0,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","set_insert_node");
        return;
      }
      set->size = set->size + 2;
    }
    if (set->used < idx) {
      ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
             "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
             ,0x438);
      local_24 = set->used;
    }
    if (local_24 < set->used) {
      memmove((set->val).nodes + (local_24 + 1),(set->val).nodes + local_24,
              (ulong)(set->used - local_24) << 4);
    }
  }
  (set->val).nodes[local_24].node = node;
  (set->val).nodes[local_24].type = node_type;
  (set->val).nodes[local_24].pos = pos;
  set->used = set->used + 1;
  set_insert_node_hash(set,node,node_type);
  return;
}

Assistant:

static void
set_insert_node(struct lyxp_set *set, const struct lyd_node *node, uint32_t pos, enum lyxp_node_type node_type, uint32_t idx)
{
    assert(set && ((set->type == LYXP_SET_NODE_SET) || (set->type == LYXP_SET_EMPTY)));

    if (set->type == LYXP_SET_EMPTY) {
        /* first item */
        if (idx) {
            /* no real harm done, but it is a bug */
            LOGINT(NULL);
            idx = 0;
        }
        set->val.nodes = malloc(LYXP_SET_SIZE_START * sizeof *set->val.nodes);
        LY_CHECK_ERR_RETURN(!set->val.nodes, LOGMEM(NULL), );
        set->type = LYXP_SET_NODE_SET;
        set->used = 0;
        set->size = LYXP_SET_SIZE_START;
        set->ctx_pos = 1;
        set->ctx_size = 1;
#ifdef LY_ENABLED_CACHE
        set->ht = NULL;
#endif
    } else {
        /* not an empty set */
        if (set->used == set->size) {

            /* set is full */
            set->val.nodes = ly_realloc(set->val.nodes, (set->size + LYXP_SET_SIZE_STEP) * sizeof *set->val.nodes);
            LY_CHECK_ERR_RETURN(!set->val.nodes, LOGMEM(NULL), );
            set->size += LYXP_SET_SIZE_STEP;
        }

        if (idx > set->used) {
            LOGINT(NULL);
            idx = set->used;
        }

        /* make space for the new node */
        if (idx < set->used) {
            memmove(&set->val.nodes[idx + 1], &set->val.nodes[idx], (set->used - idx) * sizeof *set->val.nodes);
        }
    }

    /* finally assign the value */
    set->val.nodes[idx].node = (struct lyd_node *)node;
    set->val.nodes[idx].type = node_type;
    set->val.nodes[idx].pos = pos;
    ++set->used;

#ifdef LY_ENABLED_CACHE
    set_insert_node_hash(set, (struct lyd_node *)node, node_type);
#endif
}